

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O2

int pool_bulk_insert(StringPool *pool,xmlHashTablePtr hash,size_t num)

{
  xmlChar xVar1;
  ulong uVar2;
  size_t sVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  xmlChar *pxVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  xmlChar tmp_key [1];
  uint local_80;
  int local_7c;
  ulong local_70;
  xmlChar *str [3];
  ulong local_50;
  
  local_70 = pool->index;
  local_50 = 0;
  local_80 = 0;
LAB_001033e0:
  if ((pool->num_strings <= local_70) || (num <= local_50)) {
    pool->index = local_70;
    return local_80;
  }
  local_7c = 0;
  do {
    for (uVar11 = 0; pxVar5 = str[2], pxVar4 = str[1], pxVar10 = str[0], uVar2 = pool->num_keys,
        uVar11 < uVar2; uVar11 = uVar11 + 1) {
      xVar1 = pool->id;
      uVar6 = my_rand(0x40);
      lVar14 = (ulong)uVar6 + 1;
      uVar7 = my_rand((uint)lVar14);
      pxVar10 = (xmlChar *)(*_xmlMalloc)(uVar6 + 2);
      for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 1) {
        uVar8 = my_rand(0x1a);
        pxVar10[lVar13] = (char)uVar8 + 'a';
      }
      pxVar10[uVar7] = xVar1;
      pxVar10[lVar14] = '\0';
      if (2 < uVar6) {
        uVar8 = my_rand(4);
        if (uVar8 != 0) {
          uVar8 = my_rand(uVar6 - 2);
          uVar6 = uVar8 + 2;
          if (uVar8 + 1 < uVar7) {
            uVar6 = uVar8 + 1;
          }
          pxVar10[uVar6] = ':';
        }
      }
      str[uVar11] = pxVar10;
    }
    if (uVar2 == 3) {
      local_7c = xmlHashAddEntry3(hash,str[0],str[1],str[2],tmp_key);
      if (local_7c == 0) {
        iVar9 = xmlHashUpdateEntry3(hash,pxVar10,pxVar4,pxVar5,pxVar10,0);
        goto LAB_001035c3;
      }
    }
    else if (uVar2 == 2) {
      local_7c = xmlHashAddEntry2(hash,str[0],str[1]);
      if (local_7c == 0) {
        iVar9 = xmlHashUpdateEntry2(hash,pxVar10,pxVar4,pxVar10,0);
        goto LAB_001035c3;
      }
    }
    else if (uVar2 == 1) {
      local_7c = xmlHashAddEntry(hash,str[0],tmp_key);
      if (local_7c == 0) break;
    }
    else if (local_7c == 0) goto LAB_001035d0;
    for (uVar11 = 0; uVar11 < pool->num_keys; uVar11 = uVar11 + 1) {
      (*_xmlFree)(str[uVar11]);
    }
  } while( true );
  iVar9 = xmlHashUpdateEntry(hash,pxVar10,pxVar10);
LAB_001035c3:
  local_80 = local_80 | -(uint)(iVar9 != 0);
LAB_001035d0:
  sVar3 = pool->num_keys;
  for (sVar12 = 0; sVar3 != sVar12; sVar12 = sVar12 + 1) {
    pool->strings[local_70] = str[sVar12];
    local_70 = local_70 + 1;
  }
  local_50 = local_50 + 1;
  goto LAB_001033e0;
}

Assistant:

static int
pool_bulk_insert(StringPool *pool, xmlHashTablePtr hash, size_t num) {
    size_t i, j;
    int ret = 0;

    for (i = pool->index, j = 0; i < pool->num_strings && j < num; j++) {
        xmlChar *str[3];
        size_t k;

        while (1) {
            xmlChar tmp_key[1];
            int res;

            for (k = 0; k < pool->num_keys; k++)
                str[k] = gen_random_string(pool->id);

            switch (pool->num_keys) {
                case 1:
                    res = xmlHashAddEntry(hash, str[0], tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry(hash, str[0], str[0], NULL) != 0)
                        ret = -1;
                    break;
                case 2:
                    res = xmlHashAddEntry2(hash, str[0], str[1], tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry2(hash, str[0], str[1], str[0],
                                            NULL) != 0)
                        ret = -1;
                    break;
                case 3:
                    res = xmlHashAddEntry3(hash, str[0], str[1], str[2],
                                           tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry3(hash, str[0], str[1], str[2],
                                            str[0], NULL) != 0)
                        ret = -1;
                    break;
            }

            if (res == 0)
                break;
            for (k = 0; k < pool->num_keys; k++)
                xmlFree(str[k]);
        }

        for (k = 0; k < pool->num_keys; k++)
            pool->strings[i++] = str[k];
    }

    pool->index = i;
    return ret;
}